

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatfile_tests.cpp
# Opt level: O2

void __thiscall flatfile_tests::flatfile_flush::test_method(flatfile_flush *this)

{
  long lVar1;
  path dir;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  undefined8 in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  _List in_stack_fffffffffffffe98;
  undefined4 local_154;
  FlatFilePos local_150;
  undefined8 local_148;
  char *local_140;
  char *local_138;
  undefined **local_130;
  undefined1 local_128;
  undefined1 *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  bool out_of_space;
  path local_e8;
  path local_c0;
  FlatFileSeq seq;
  path data_dir;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase
            ((path *)&data_dir.super_path,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args);
  std::filesystem::__cxx11::path::path(&local_c0,&data_dir.super_path);
  dir.super_path._M_pathname._M_string_length = in_stack_fffffffffffffe80;
  dir.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe78;
  dir.super_path._M_pathname.field_2._M_allocated_capacity = in_stack_fffffffffffffe88;
  dir.super_path._M_pathname.field_2._8_8_ = in_stack_fffffffffffffe90;
  dir.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       in_stack_fffffffffffffe98._M_impl._M_t.
       super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
       ._M_t.
       super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
       .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
  FlatFileSeq::FlatFileSeq(&seq,dir,(char *)&local_c0,0xbaa2de);
  std::filesystem::__cxx11::path::~path(&local_c0);
  local_e8._M_pathname._M_dataplus._M_p = (pointer)0x0;
  FlatFileSeq::Allocate(&seq,(FlatFilePos *)&local_e8,1,&out_of_space);
  local_e8._M_pathname._M_dataplus._M_p = (pointer)0x100000000;
  FlatFileSeq::Flush(&seq,(FlatFilePos *)&local_e8,false);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x7a;
  file.m_begin = (iterator)&local_100;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_110,msg);
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_011480b0;
  local_120 = boost::unit_test::lazy_ostream::inst;
  local_118 = "";
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_138 = "";
  local_150.nFile = 0;
  local_150.nPos = 1;
  FlatFileSeq::FileName((path *)&local_e8,&seq,&local_150);
  local_148 = std::filesystem::file_size(&local_e8);
  pvVar3 = (iterator)&local_148;
  local_154 = 100;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_130,&local_140,0x7a,1,2,pvVar3,"fs::file_size(seq.FileName(FlatFilePos(0, 1)))",
             &local_154,"100U");
  std::filesystem::__cxx11::path::~path((path *)&local_e8);
  local_e8._M_pathname._M_dataplus._M_p = (pointer)0x100000000;
  FlatFileSeq::Flush(&seq,(FlatFilePos *)&local_e8,true);
  file_00.m_end = (iterator)0x7e;
  file_00.m_begin = &stack0xfffffffffffffe98;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
             (size_t)&stack0xfffffffffffffe88,msg_00);
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_011480b0;
  local_120 = boost::unit_test::lazy_ostream::inst;
  local_118 = "";
  local_150.nFile = 0;
  local_150.nPos = 1;
  FlatFileSeq::FileName((path *)&local_e8,&seq,&local_150);
  local_148 = std::filesystem::file_size(&local_e8);
  local_154 = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_130,&stack0xfffffffffffffe78,0x7e,1,2,&local_148,
             "fs::file_size(seq.FileName(FlatFilePos(0, 1)))",&local_154,"1U");
  std::filesystem::__cxx11::path::~path((path *)&local_e8);
  std::filesystem::__cxx11::path::~path((path *)&seq);
  std::filesystem::__cxx11::path::~path(&data_dir.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(flatfile_flush)
{
    const auto data_dir = m_args.GetDataDirBase();
    FlatFileSeq seq(data_dir, "a", 100);

    bool out_of_space;
    seq.Allocate(FlatFilePos(0, 0), 1, out_of_space);

    // Flush without finalize should not truncate file.
    seq.Flush(FlatFilePos(0, 1));
    BOOST_CHECK_EQUAL(fs::file_size(seq.FileName(FlatFilePos(0, 1))), 100U);

    // Flush with finalize should truncate file.
    seq.Flush(FlatFilePos(0, 1), true);
    BOOST_CHECK_EQUAL(fs::file_size(seq.FileName(FlatFilePos(0, 1))), 1U);
}